

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::UntypedMessage::
InsertField<google::protobuf::json_internal::UntypedMessage>
          (UntypedMessage *this,Field *field,UntypedMessage *value)

{
  bool bVar1;
  Field_Cardinality FVar2;
  Field *pFVar3;
  pointer prVar4;
  variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
  *this_00;
  basic_string_view<char,_std::char_traits<char>_> *args_1;
  UntypedMessage *in_RCX;
  int __c;
  char *__s;
  char *local_178;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)655355>
  local_170;
  string local_160;
  undefined1 local_140 [16];
  undefined1 local_130 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name;
  type *extant_1;
  vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
  repeated;
  type *extant;
  Value *slot;
  AlphaNum local_d8;
  AlphaNum local_a8;
  undefined1 local_78 [48];
  undefined1 local_48 [8];
  pair<_68213803_> emplace_result;
  int32_t number;
  UntypedMessage *value_local;
  Field *field_local;
  UntypedMessage *this_local;
  
  pFVar3 = ResolverPool::Field::proto((Field *)value);
  emplace_result._20_4_ = Field::number(pFVar3);
  absl::lts_20240722::container_internal::raw_hash_map<$2385b75b$>::
  try_emplace<int,_google::protobuf::json_internal::UntypedMessage,_0>
            ((pair<_68213803_> *)local_48,(raw_hash_map<_2385b75b_> *)&field->raw_,
             (key_arg<int> *)&emplace_result.field_0x14,in_RCX);
  if ((emplace_result.first.field_1._0_1_ & 1) == 0) {
    pFVar3 = ResolverPool::Field::proto((Field *)value);
    FVar2 = Field::cardinality(pFVar3);
    if (FVar2 == Field_Cardinality_CARDINALITY_REPEATED) {
      prVar4 = absl::lts_20240722::container_internal::raw_hash_set<$2385b75b$>::iterator::
               operator->((iterator *)local_48);
      this_00 = &prVar4->second;
      repeated.
      super__Vector_base<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           std::
           get_if<google::protobuf::json_internal::UntypedMessage,google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
                     (this_00);
      if (repeated.
          super__Vector_base<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage ==
          (add_pointer_t<google::protobuf::json_internal::UntypedMessage>)0x0) {
        name.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_
             = std::
               get_if<std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>,google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
                         (this_00);
        if ((add_pointer_t<std::vector<google::protobuf::json_internal::UntypedMessage>_>)
            name.
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _16_8_ == (add_pointer_t<std::vector<google::protobuf::json_internal::UntypedMessage>_>)
                      0x0) {
          internal::RttiTypeName<google::protobuf::json_internal::UntypedMessage>();
          bVar1 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             local_130);
          if (!bVar1) {
            std::optional<std::basic_string_view<char,std::char_traits<char>>>::operator=
                      ((optional<std::basic_string_view<char,std::char_traits<char>>> *)local_130,
                       (char (*) [10])"<unknown>");
          }
          __s = "inconsistent types for field number %d: tried to insert \'%s\', but index was %d";
          absl::lts_20240722::str_format_internal::
          FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)655355>
          ::FormatSpecTemplate
                    (&local_170,
                     "inconsistent types for field number %d: tried to insert \'%s\', but index was %d"
                    );
          args_1 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                             ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              local_130);
          local_178 = std::
                      variant<google::protobuf::json_internal::UntypedMessage::Bool,_int,_unsigned_int,_long,_unsigned_long,_float,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::UntypedMessage,_std::vector<google::protobuf::json_internal::UntypedMessage::Bool,_std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>_>
                      ::index(this_00,__s,__c);
          absl::lts_20240722::
          StrFormat<int,_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    (&local_160,&local_170,(int *)&emplace_result.field_0x14,args_1,
                     (unsigned_long *)&local_178);
          local_140 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_160)
          ;
          absl::lts_20240722::InvalidArgumentError(this,local_140._0_8_,local_140._8_8_);
          std::__cxx11::string::~string((string *)&local_160);
          return (Status)(uintptr_t)this;
        }
        std::
        vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
        ::push_back((vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
                     *)name.
                       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       ._16_8_,in_RCX);
      }
      else {
        std::
        vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
        ::vector((vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
                  *)&extant_1);
        std::
        vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
        ::push_back((vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
                     *)&extant_1,
                    repeated.
                    super__Vector_base<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
        ::push_back((vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
                     *)&extant_1,in_RCX);
        std::
        variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
        ::operator=((variant<google::protobuf::json_internal::UntypedMessage::Bool,int,unsigned_int,long,unsigned_long,float,double,std::__cxx11::string,google::protobuf::json_internal::UntypedMessage,std::vector<google::protobuf::json_internal::UntypedMessage::Bool,std::allocator<google::protobuf::json_internal::UntypedMessage::Bool>>,std::vector<int,std::allocator<int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<long,std::allocator<long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<google::protobuf::json_internal::UntypedMessage,std::allocator<google::protobuf::json_internal::UntypedMessage>>>
                     *)this_00,
                    (vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
                     *)&extant_1);
        std::
        vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
        ::~vector((vector<google::protobuf::json_internal::UntypedMessage,_std::allocator<google::protobuf::json_internal::UntypedMessage>_>
                   *)&extant_1);
      }
      absl::lts_20240722::OkStatus();
    }
    else {
      absl::lts_20240722::AlphaNum::AlphaNum
                (&local_a8,"repeated entries for singular field number ");
      absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,emplace_result._20_4_);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_78,&local_a8);
      local_78._32_16_ =
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
      absl::lts_20240722::InvalidArgumentError(this,local_78._32_8_,local_78._40_8_);
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  else {
    absl::lts_20240722::OkStatus();
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status UntypedMessage::InsertField(const ResolverPool::Field& field,
                                         T&& value) {
  int32_t number = field.proto().number();
  auto emplace_result = fields_.try_emplace(number, std::forward<T>(value));
  if (emplace_result.second) {
    return absl::OkStatus();
  }

  if (field.proto().cardinality() !=
      google::protobuf::Field::CARDINALITY_REPEATED) {
    return absl::InvalidArgumentError(
        absl::StrCat("repeated entries for singular field number ", number));
  }

  Value& slot = emplace_result.first->second;
  using value_type = std::decay_t<T>;
  if (auto* extant = absl::get_if<value_type>(&slot)) {
    std::vector<value_type> repeated;
    repeated.push_back(std::move(*extant));
    repeated.push_back(std::forward<T>(value));

    slot = std::move(repeated);
  } else if (auto* extant = absl::get_if<std::vector<value_type>>(&slot)) {
    extant->push_back(std::forward<T>(value));
  } else {
    absl::optional<absl::string_view> name =
        google::protobuf::internal::RttiTypeName<value_type>();
    if (!name.has_value()) {
      name = "<unknown>";
    }

    return absl::InvalidArgumentError(
        absl::StrFormat("inconsistent types for field number %d: tried to "
                        "insert '%s', but index was %d",
                        number, *name, slot.index()));
  }

  return absl::OkStatus();
}